

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O3

void google::protobuf::compiler::java::anon_unknown_6::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  pointer pcVar3;
  bool bVar4;
  JavaType JVar5;
  Type TVar6;
  int iVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  ClassNameResolver *name_resolver_00;
  char *pcVar10;
  long *plVar11;
  undefined8 *puVar12;
  uint uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int extraout_EDX_35;
  int extraout_EDX_36;
  int extraout_EDX_37;
  int extraout_EDX_38;
  int extraout_EDX_39;
  int extraout_EDX_40;
  int extraout_EDX_41;
  int extraout_EDX_42;
  int extraout_EDX_43;
  int extraout_EDX_44;
  int extraout_EDX_45;
  int extraout_EDX_46;
  _Alloc_hider _Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  undefined1 immutable;
  string capitalized_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  key_type local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  key_type local_f0;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  uint local_ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  key_type local_a0;
  uint local_7c;
  key_type local_78;
  ClassNameResolver *local_58;
  key_type local_50;
  
  local_ac = builderBitIndex;
  local_7c = messageBitIndex;
  local_58 = name_resolver;
  SetCommonFieldVariables(descriptor,info,variables);
  JVar5 = GetJavaType(descriptor);
  pcVar8 = PrimitiveTypeName(JVar5);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"type","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_140);
  pcVar10 = (char *)pmVar9->_M_string_length;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar10,(ulong)pcVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  pcVar8 = BoxedPrimitiveTypeName(JVar5);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"boxed_type","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_140);
  pcVar10 = (char *)pmVar9->_M_string_length;
  name_resolver_00 = (ClassNameResolver *)strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar10,(ulong)pcVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"type","");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](variables,&local_140);
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"field_type","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_f0);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)descriptor;
  if (JVar5 < JAVATYPE_STRING) {
    pcVar10 = PrimitiveTypeName(JVar5);
    std::__cxx11::string::string((string *)&local_f0,pcVar10,(allocator *)&local_110);
    UnderscoresToCamelCase(&local_140,&local_f0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    std::operator+(&local_110,"com.google.protobuf.Internal.",&local_140);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar14) {
      local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)paVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar2 = (code *)(local_d0 + 0x10);
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"field_list_type","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f0);
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    paVar14 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    std::operator+(&local_110,"empty",&local_140);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"empty_list","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f0);
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    std::operator+(&local_110,"new",&local_140);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"create_list","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f0);
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::operator+(&local_110,"mutableCopy(",pmVar9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    paVar15 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"mutable_copy_list","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar15) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    pcVar3 = (pmVar9->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar3,pcVar3 + pmVar9->_M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name_make_immutable","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f0);
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    pcVar3 = (pmVar9->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + pmVar9->_M_string_length);
    std::__cxx11::string::append((char *)&local_110);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_110,(ulong)local_140._M_dataplus._M_p);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"repeated_get","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar15) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    pcVar3 = (pmVar9->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + pmVar9->_M_string_length);
    std::__cxx11::string::append((char *)&local_110);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_110,(ulong)local_140._M_dataplus._M_p);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"repeated_add","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar15) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    pcVar3 = (pmVar9->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + pmVar9->_M_string_length);
    std::__cxx11::string::append((char *)&local_110);
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_140._M_dataplus._M_p);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 == paVar17) {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0.field_2._8_8_ = puVar12[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_f0._M_string_length = puVar12[1];
    *puVar12 = paVar17;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"repeated_set","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar15) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    immutable = SUB81(local_58,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    paVar17 = local_a8;
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    _Var16._M_p = local_140._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
LAB_002dcc9d:
      operator_delete(_Var16._M_p);
    }
  }
  else {
    paVar14 = &local_110.field_2;
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"boxed_type","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    paVar15 = &local_140.field_2;
    std::operator+(&local_f0,"java.util.List<",pmVar9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140.field_2._8_8_ = plVar11[3];
      local_140._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_140._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar2 = (code *)(local_d0 + 0x10);
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"field_list_type","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar15) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"boxed_type","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::operator+(&local_f0,"new java.util.ArrayList<",pmVar9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140.field_2._8_8_ = plVar11[3];
      local_140._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_140._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"create_list","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar15) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"boxed_type","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "new java.util.ArrayList<",pmVar9);
    plVar11 = (long *)std::__cxx11::string::append(local_d0);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_110.field_2._8_4_ = (undefined4)plVar11[3];
      local_110.field_2._12_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
      local_110._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_110._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_110._M_string_length = plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    paVar15 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_78);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_110,(ulong)(pmVar9->_M_dataplus)._M_p);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140.field_2._8_8_ = plVar11[3];
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_140._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mutable_copy_list","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_50);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    immutable = SUB81(local_58,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar15) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"empty_list","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_140);
    name_resolver_00 = (ClassNameResolver *)0x21;
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3d2f0b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    local_d0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    pcVar3 = (pmVar9->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + pmVar9->_M_string_length);
    std::__cxx11::string::append((char *)&local_110);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_110,(ulong)(pmVar9->_M_dataplus)._M_p);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140.field_2._8_8_ = plVar11[3];
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_140._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_78._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name_make_immutable","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_78);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar15) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    paVar15 = &local_140.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar15) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((code *)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_);
    }
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"name","");
    paVar17 = local_a8;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_f0);
    pcVar3 = (pmVar9->_M_dataplus)._M_p;
    local_140._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar3,pcVar3 + pmVar9->_M_string_length);
    std::__cxx11::string::append((char *)&local_140);
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"repeated_get","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar15) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_f0);
    pcVar3 = (pmVar9->_M_dataplus)._M_p;
    local_140._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar3,pcVar3 + pmVar9->_M_string_length);
    std::__cxx11::string::append((char *)&local_140);
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"repeated_add","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar15) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"name","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_f0);
    pcVar3 = (pmVar9->_M_dataplus)._M_p;
    local_140._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar3,pcVar3 + pmVar9->_M_string_length);
    std::__cxx11::string::append((char *)&local_140);
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"repeated_set","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar15) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    _Var16._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) goto LAB_002dcc9d;
  }
  DefaultValue_abi_cxx11_
            (&local_140,(java *)paVar17->_M_local_buf,(FieldDescriptor *)0x1,(bool)immutable,
             name_resolver_00);
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"default","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_f0);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  bVar4 = IsDefaultValueJavaDefault((FieldDescriptor *)paVar17->_M_local_buf);
  if (bVar4) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
  }
  else {
    DefaultValue_abi_cxx11_
              (&local_f0,(java *)paVar17->_M_local_buf,(FieldDescriptor *)0x1,(bool)immutable,
               name_resolver_00);
    puVar12 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x395d33);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 == paVar14) {
      local_140.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_140.field_2._8_8_ = puVar12[3];
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_140._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_140._M_string_length = puVar12[1];
    *puVar12 = paVar14;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
  }
  paVar14 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"default_init","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((!bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1)) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  pcVar8 = GetCapitalizedType((FieldDescriptor *)local_a8->_M_local_buf,true);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"capitalized_type","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_140);
  pcVar10 = (char *)pmVar9->_M_string_length;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar10,(ulong)pcVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  iVar7 = *(int *)(local_a8->_M_local_buf + 0x44);
  bVar4 = FieldDescriptor::is_packed((FieldDescriptor *)local_a8->_M_local_buf);
  paVar1 = local_a8;
  uVar13 = 2;
  if (!bVar4) {
    if (*(once_flag **)(local_a8->_M_local_buf + 0x30) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_a0._M_dataplus._M_p = (pointer)local_a8;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(local_a8->_M_local_buf + 0x30),
                 (_func_void_FieldDescriptor_ptr **)local_d0,(FieldDescriptor **)&local_a0);
    }
    uVar13 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                      (ulong)*(uint *)(paVar1->_M_local_buf + 0x38) * 4);
  }
  paVar1 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar1;
  pcVar10 = FastInt32ToBufferLeft(iVar7 << 3 | uVar13,paVar1->_M_local_buf);
  local_140._M_string_length = (long)pcVar10 - (long)paVar1;
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,local_140._M_dataplus._M_p,
             local_140._M_dataplus._M_p + local_140._M_string_length);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_d0 + 0x10);
  local_d0._0_8_ = paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"tag","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_d0);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._0_8_ != paVar15) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  iVar7 = *(int *)(local_a8->_M_local_buf + 0x44);
  TVar6 = GetType((FieldDescriptor *)local_a8->_M_local_buf);
  uVar13 = iVar7 * 8 + 1;
  iVar7 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> iVar7 == 0; iVar7 = iVar7 + -1) {
    }
  }
  local_140._M_dataplus._M_p = (pointer)paVar1;
  pcVar10 = FastUInt64ToBufferLeft
                      ((ulong)(iVar7 * 9 + 0x49U >> 6) << (TVar6 == TYPE_GROUP),paVar1->_M_local_buf
                      );
  local_140._M_string_length = (long)pcVar10 - (long)paVar1;
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,local_140._M_dataplus._M_p,
             local_140._M_dataplus._M_p + local_140._M_string_length);
  local_d0._0_8_ = paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"tag_size","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_d0);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._0_8_ != paVar15) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  JVar5 = GetJavaType((FieldDescriptor *)local_a8->_M_local_buf);
  bVar4 = IsReferenceType(JVar5);
  if (bVar4) {
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"null_check","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_140);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3d2f77);
  }
  else {
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"null_check","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_140);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x38f545);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  pcVar10 = "";
  if (*(char *)(*(long *)(local_a8->_M_local_buf + 0x78) + 0x4e) != '\0') {
    pcVar10 = "@java.lang.Deprecated ";
  }
  local_140._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"deprecation","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_140);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,(ulong)pcVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  TVar6 = GetType((FieldDescriptor *)local_a8->_M_local_buf);
  iVar7 = FixedSize(TVar6);
  if (iVar7 != -1) {
    local_140._M_dataplus._M_p = (pointer)paVar1;
    pcVar10 = FastInt32ToBufferLeft(iVar7,paVar1->_M_local_buf);
    local_140._M_string_length = (long)pcVar10 - (long)paVar1;
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,local_140._M_dataplus._M_p,
               local_140._M_dataplus._M_p + local_140._M_string_length);
    local_d0._0_8_ = paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"fixed_size","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != paVar15) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  local_140._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"on_changed","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_140);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3c9201);
  iVar7 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
    iVar7 = extraout_EDX_00;
  }
  if (*(int *)(*(long *)(local_a8->_M_local_buf + 0x28) + 0x3c) == 3) {
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"set_has_field_bit_message","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_140);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x38f545);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"set_has_field_bit_builder","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_140);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x38f545);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"clear_has_field_bit_builder","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_140);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x38f545);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    paVar17 = local_a8;
    if (*(once_flag **)(local_a8->_M_local_buf + 0x30) != (once_flag *)0x0) {
      local_140._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_110._M_dataplus._M_p = (pointer)local_a8;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(local_a8->_M_local_buf + 0x30),
                 (_func_void_FieldDescriptor_ptr **)&local_140,(FieldDescriptor **)&local_110);
    }
    if (*(int *)(paVar17->_M_local_buf + 0x38) == 0xc) {
      local_d0._0_8_ = paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)local_d0);
      std::operator+(&local_110,"!",pmVar9);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar17) {
        local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_140.field_2._8_8_ = plVar11[3];
        local_140._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_140._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_140._M_string_length = plVar11[1];
      *plVar11 = (long)paVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"is_field_present_message","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_a0);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
      iVar7 = extraout_EDX_40;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
        iVar7 = extraout_EDX_41;
      }
      _Var16._M_p = local_140._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
LAB_002ddb7f:
        operator_delete(_Var16._M_p);
        iVar7 = extraout_EDX_42;
      }
    }
    else {
      local_d0._0_8_ = paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)local_d0);
      pcVar3 = (pmVar9->_M_dataplus)._M_p;
      local_110._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,pcVar3 + pmVar9->_M_string_length);
      std::__cxx11::string::append((char *)&local_110);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"default","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_a0);
      puVar12 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_110,(ulong)(pmVar9->_M_dataplus)._M_p);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 == paVar17) {
        local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_140.field_2._8_8_ = puVar12[3];
        local_140._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_140._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_140._M_string_length = puVar12[1];
      *puVar12 = paVar17;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"is_field_present_message","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_78);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
      iVar7 = extraout_EDX_44;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
        iVar7 = extraout_EDX_45;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
        iVar7 = extraout_EDX_46;
      }
      _Var16._M_p = local_a0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_002ddb7f;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
      iVar7 = extraout_EDX_43;
    }
    _Var16._M_p = (pointer)local_d0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ == paVar15) goto LAB_002dd832;
  }
  else {
    GenerateGetBit_abi_cxx11_(&local_140,(java *)(ulong)local_7c,iVar7);
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"get_has_field_bit_message","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    iVar7 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
      iVar7 = extraout_EDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
      iVar7 = extraout_EDX_03;
    }
    GenerateGetBit_abi_cxx11_(&local_140,(java *)(ulong)local_ac,iVar7);
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"get_has_field_bit_builder","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    iVar7 = extraout_EDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
      iVar7 = extraout_EDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
      iVar7 = extraout_EDX_06;
    }
    GenerateSetBit_abi_cxx11_(&local_110,(java *)(ulong)local_7c,iVar7);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140.field_2._8_8_ = plVar11[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_140._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_d0._0_8_ = paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"set_has_field_bit_message","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    iVar7 = extraout_EDX_07;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != paVar15) {
      operator_delete((void *)local_d0._0_8_);
      iVar7 = extraout_EDX_08;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
      iVar7 = extraout_EDX_09;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
      iVar7 = extraout_EDX_10;
    }
    GenerateSetBit_abi_cxx11_(&local_110,(java *)(ulong)local_ac,iVar7);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140.field_2._8_8_ = plVar11[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_140._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_d0._0_8_ = paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"set_has_field_bit_builder","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    iVar7 = extraout_EDX_11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != paVar15) {
      operator_delete((void *)local_d0._0_8_);
      iVar7 = extraout_EDX_12;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
      iVar7 = extraout_EDX_13;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
      iVar7 = extraout_EDX_14;
    }
    GenerateClearBit_abi_cxx11_(&local_110,(java *)(ulong)local_ac,iVar7);
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 == paVar17) {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140.field_2._8_8_ = puVar12[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_140._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_140._M_string_length = puVar12[1];
    *puVar12 = paVar17;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    local_d0._0_8_ = paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"clear_has_field_bit_builder","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    iVar7 = extraout_EDX_15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != paVar15) {
      operator_delete((void *)local_d0._0_8_);
      iVar7 = extraout_EDX_16;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
      iVar7 = extraout_EDX_17;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
      iVar7 = extraout_EDX_18;
    }
    GenerateGetBit_abi_cxx11_(&local_140,(java *)(ulong)local_7c,iVar7);
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"is_field_present_message","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
    iVar7 = extraout_EDX_19;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p);
      iVar7 = extraout_EDX_20;
    }
    _Var16._M_p = local_140._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == paVar1) goto LAB_002dd832;
  }
  operator_delete(_Var16._M_p);
  iVar7 = extraout_EDX_21;
LAB_002dd832:
  GenerateGetBit_abi_cxx11_(&local_140,(java *)(ulong)local_ac,iVar7);
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"get_mutable_bit_builder","")
  ;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
  iVar7 = extraout_EDX_22;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
    iVar7 = extraout_EDX_23;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
    iVar7 = extraout_EDX_24;
  }
  GenerateSetBit_abi_cxx11_(&local_140,(java *)(ulong)local_ac,iVar7);
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"set_mutable_bit_builder","")
  ;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
  iVar7 = extraout_EDX_25;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
    iVar7 = extraout_EDX_26;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
    iVar7 = extraout_EDX_27;
  }
  GenerateClearBit_abi_cxx11_(&local_140,(java *)(ulong)local_ac,iVar7);
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"clear_mutable_bit_builder","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
  iVar7 = extraout_EDX_28;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
    iVar7 = extraout_EDX_29;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
    iVar7 = extraout_EDX_30;
  }
  GenerateGetBitMutableLocal_abi_cxx11_(&local_140,(java *)(ulong)local_ac,iVar7);
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"get_mutable_bit_parser","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
  iVar7 = extraout_EDX_31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
    iVar7 = extraout_EDX_32;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
    iVar7 = extraout_EDX_33;
  }
  GenerateSetBitMutableLocal_abi_cxx11_(&local_140,(java *)(ulong)local_ac,iVar7);
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"set_mutable_bit_parser","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
  iVar7 = extraout_EDX_34;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
    iVar7 = extraout_EDX_35;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
    iVar7 = extraout_EDX_36;
  }
  GenerateGetBitFromLocal_abi_cxx11_(&local_140,(java *)(ulong)local_ac,iVar7);
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"get_has_field_bit_from_local","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
  iVar7 = extraout_EDX_37;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
    iVar7 = extraout_EDX_38;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
    iVar7 = extraout_EDX_39;
  }
  GenerateSetBitToLocal_abi_cxx11_(&local_140,(java *)(ulong)local_7c,iVar7);
  local_110._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"set_has_field_bit_to_local","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex, int builderBitIndex,
                           const FieldGeneratorInfo* info,
                           ClassNameResolver* name_resolver,
                           std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["empty_list"] = "com.google.protobuf.LazyStringArrayList.EMPTY";

  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_init"] =
      "= " + ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["capitalized_type"] = "String";
  (*variables)["tag"] =
      StrCat(static_cast<int32>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  (*variables)["null_check"] =
      "  if (value == null) {\n"
      "    throw new NullPointerException();\n"
      "  }\n";
  (*variables)["writeString"] = "com.google.protobuf.GeneratedMessage" +
                                GeneratedCodeVersionSuffix() + ".writeString";
  (*variables)["computeStringSize"] = "com.google.protobuf.GeneratedMessage" +
                                      GeneratedCodeVersionSuffix() +
                                      ".computeStringSize";

  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["on_changed"] = "onChanged();";

  if (SupportFieldPresence(descriptor->file())) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
    (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["set_has_field_bit_builder"] =
        GenerateSetBit(builderBitIndex) + ";";
    (*variables)["clear_has_field_bit_builder"] =
        GenerateClearBit(builderBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["set_has_field_bit_builder"] = "";
    (*variables)["clear_has_field_bit_builder"] = "";

    (*variables)["is_field_present_message"] =
        "!get" + (*variables)["capitalized_name"] + "Bytes().isEmpty()";
  }

  // For repeated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}